

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_scale_sse4.c
# Opt level: O0

void hfilter8(uint8_t *src,int src_stride,int16_t *dst,int w,int h,int subpel_x_qn,int x_step_qn,
             InterpFilterParams *filter_params,int round)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  long lVar12;
  undefined1 (*pauVar13) [16];
  undefined8 *puVar14;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  uint in_R9D;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int k;
  int32_t sum;
  uint8_t *src_row;
  __m128i shifted;
  __m128i conv;
  __m128i conv23lo;
  __m128i conv01lo;
  __m128i conv3lo;
  __m128i conv2lo;
  __m128i conv1lo;
  __m128i conv0lo;
  __m128i data3lo;
  __m128i data2lo;
  __m128i data1lo;
  __m128i data0lo;
  __m128i data38;
  __m128i data28;
  __m128i data18;
  __m128i data08;
  uint8_t *src3;
  uint8_t *src2;
  uint8_t *src1;
  uint8_t *src0;
  int y;
  __m128i zero;
  __m128i coefflo;
  int16_t *filter;
  int filter_idx;
  uint8_t *src_col;
  int x;
  int x_qn;
  __m128i round_shift;
  __m128i round_add;
  int32_t round_add32;
  int ntaps;
  int bd;
  int local_4a8;
  int local_4a4;
  undefined8 local_498;
  undefined8 uStack_490;
  int local_36c;
  int local_330;
  uint local_32c;
  byte local_1f8;
  undefined1 uStack_1f7;
  undefined1 uStack_1f6;
  undefined1 uStack_1f5;
  byte bStack_1f4;
  undefined1 uStack_1f3;
  undefined1 uStack_1f2;
  undefined1 uStack_1f1;
  byte local_1d8;
  undefined1 uStack_1d7;
  undefined1 uStack_1d6;
  undefined1 uStack_1d5;
  byte bStack_1d4;
  undefined1 uStack_1d3;
  undefined1 uStack_1d2;
  undefined1 uStack_1d1;
  byte local_1b8;
  undefined1 uStack_1b7;
  undefined1 uStack_1b6;
  undefined1 uStack_1b5;
  byte bStack_1b4;
  undefined1 uStack_1b3;
  undefined1 uStack_1b2;
  undefined1 uStack_1b1;
  byte local_198;
  undefined1 uStack_197;
  undefined1 uStack_196;
  undefined1 uStack_195;
  byte bStack_194;
  undefined1 uStack_193;
  undefined1 uStack_192;
  undefined1 uStack_191;
  int iStack_94;
  int local_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  
  iVar11 = (1 << ((byte)shifted[1] & 0x1f)) / 2 + 0x4000;
  local_32c = in_R9D;
  for (local_330 = 0; local_330 < in_ECX; local_330 = local_330 + 1) {
    lVar12 = in_RDI + -3 + (long)((int)local_32c >> 10);
    pauVar13 = (undefined1 (*) [16])
               av1_get_interp_filter_subpel_kernel
                         ((InterpFilterParams *)shifted[0],local_32c >> 6 & 0xf);
    auVar10 = *pauVar13;
    auVar9 = *pauVar13;
    auVar8 = *pauVar13;
    auVar7 = *pauVar13;
    for (local_36c = 0; local_36c <= in_R8D + -4; local_36c = local_36c + 4) {
      puVar14 = (undefined8 *)(lVar12 + local_36c * in_ESI);
      uVar1 = *puVar14;
      uVar2 = *(undefined8 *)((long)puVar14 + (long)in_ESI);
      uVar3 = *(undefined8 *)((long)puVar14 + (long)(in_ESI * 2));
      uVar4 = *(undefined8 *)((long)puVar14 + (long)(in_ESI * 3));
      local_198 = (byte)uVar1;
      uStack_197 = (undefined1)((ulong)uVar1 >> 8);
      uStack_196 = (undefined1)((ulong)uVar1 >> 0x10);
      uStack_195 = (undefined1)((ulong)uVar1 >> 0x18);
      bStack_194 = (byte)((ulong)uVar1 >> 0x20);
      uStack_193 = (undefined1)((ulong)uVar1 >> 0x28);
      uStack_192 = (undefined1)((ulong)uVar1 >> 0x30);
      uStack_191 = (undefined1)((ulong)uVar1 >> 0x38);
      local_1b8 = (byte)uVar2;
      uStack_1b7 = (undefined1)((ulong)uVar2 >> 8);
      uStack_1b6 = (undefined1)((ulong)uVar2 >> 0x10);
      uStack_1b5 = (undefined1)((ulong)uVar2 >> 0x18);
      bStack_1b4 = (byte)((ulong)uVar2 >> 0x20);
      uStack_1b3 = (undefined1)((ulong)uVar2 >> 0x28);
      uStack_1b2 = (undefined1)((ulong)uVar2 >> 0x30);
      uStack_1b1 = (undefined1)((ulong)uVar2 >> 0x38);
      local_1d8 = (byte)uVar3;
      uStack_1d7 = (undefined1)((ulong)uVar3 >> 8);
      uStack_1d6 = (undefined1)((ulong)uVar3 >> 0x10);
      uStack_1d5 = (undefined1)((ulong)uVar3 >> 0x18);
      bStack_1d4 = (byte)((ulong)uVar3 >> 0x20);
      uStack_1d3 = (undefined1)((ulong)uVar3 >> 0x28);
      uStack_1d2 = (undefined1)((ulong)uVar3 >> 0x30);
      uStack_1d1 = (undefined1)((ulong)uVar3 >> 0x38);
      local_1f8 = (byte)uVar4;
      uStack_1f7 = (undefined1)((ulong)uVar4 >> 8);
      uStack_1f6 = (undefined1)((ulong)uVar4 >> 0x10);
      uStack_1f5 = (undefined1)((ulong)uVar4 >> 0x18);
      bStack_1f4 = (byte)((ulong)uVar4 >> 0x20);
      uStack_1f3 = (undefined1)((ulong)uVar4 >> 0x28);
      uStack_1f2 = (undefined1)((ulong)uVar4 >> 0x30);
      uStack_1f1 = (undefined1)((ulong)uVar4 >> 0x38);
      auVar15[1] = 0;
      auVar15[0] = local_198;
      auVar15[2] = uStack_197;
      auVar15[3] = 0;
      auVar15[4] = uStack_196;
      auVar15[5] = 0;
      auVar15[6] = uStack_195;
      auVar15[7] = 0;
      auVar15[9] = 0;
      auVar15[8] = bStack_194;
      auVar15[10] = uStack_193;
      auVar15[0xb] = 0;
      auVar15[0xc] = uStack_192;
      auVar15[0xd] = 0;
      auVar15[0xe] = uStack_191;
      auVar15[0xf] = 0;
      auVar15 = pmaddwd(auVar15,auVar7);
      auVar16[1] = 0;
      auVar16[0] = local_1b8;
      auVar16[2] = uStack_1b7;
      auVar16[3] = 0;
      auVar16[4] = uStack_1b6;
      auVar16[5] = 0;
      auVar16[6] = uStack_1b5;
      auVar16[7] = 0;
      auVar16[9] = 0;
      auVar16[8] = bStack_1b4;
      auVar16[10] = uStack_1b3;
      auVar16[0xb] = 0;
      auVar16[0xc] = uStack_1b2;
      auVar16[0xd] = 0;
      auVar16[0xe] = uStack_1b1;
      auVar16[0xf] = 0;
      auVar16 = pmaddwd(auVar16,auVar8);
      auVar17[1] = 0;
      auVar17[0] = local_1d8;
      auVar17[2] = uStack_1d7;
      auVar17[3] = 0;
      auVar17[4] = uStack_1d6;
      auVar17[5] = 0;
      auVar17[6] = uStack_1d5;
      auVar17[7] = 0;
      auVar17[9] = 0;
      auVar17[8] = bStack_1d4;
      auVar17[10] = uStack_1d3;
      auVar17[0xb] = 0;
      auVar17[0xc] = uStack_1d2;
      auVar17[0xd] = 0;
      auVar17[0xe] = uStack_1d1;
      auVar17[0xf] = 0;
      auVar17 = pmaddwd(auVar17,auVar9);
      auVar18[1] = 0;
      auVar18[0] = local_1f8;
      auVar18[2] = uStack_1f7;
      auVar18[3] = 0;
      auVar18[4] = uStack_1f6;
      auVar18[5] = 0;
      auVar18[6] = uStack_1f5;
      auVar18[7] = 0;
      auVar18[9] = 0;
      auVar18[8] = bStack_1f4;
      auVar18[10] = uStack_1f3;
      auVar18[0xb] = 0;
      auVar18[0xc] = uStack_1f2;
      auVar18[0xd] = 0;
      auVar18[0xe] = uStack_1f1;
      auVar18[0xf] = 0;
      auVar18 = pmaddwd(auVar18,auVar10);
      auVar16 = phaddd(auVar15,auVar16);
      auVar18 = phaddd(auVar17,auVar18);
      auVar18 = phaddd(auVar16,auVar18);
      local_78 = auVar18._0_4_;
      iStack_74 = auVar18._4_4_;
      iStack_70 = auVar18._8_4_;
      iStack_6c = auVar18._12_4_;
      iStack_74 = iStack_74 + iVar11;
      iStack_94 = (int)(CONCAT17((char)((uint)iStack_74 >> 0x18),
                                 CONCAT16((char)((uint)iStack_74 >> 0x10),
                                          CONCAT15((char)((uint)iStack_74 >> 8),
                                                   CONCAT14((char)iStack_74,local_78 + iVar11)))) >>
                       0x20);
      auVar18 = ZEXT416((uint)shifted[1]);
      local_498 = CONCAT44(iStack_94 >> auVar18,local_78 + iVar11 >> auVar18);
      uStack_490._0_4_ = iStack_70 + iVar11 >> auVar18;
      uStack_490._4_4_ = iStack_6c + iVar11 >> auVar18;
      auVar6._8_8_ = uStack_490;
      auVar6._0_8_ = local_498;
      auVar5._8_8_ = uStack_490;
      auVar5._0_8_ = local_498;
      auVar18 = packusdw(auVar6,auVar5);
      local_498 = auVar18._0_8_;
      *(undefined8 *)(in_RDX + (long)local_36c * 2 + (long)(local_330 * in_R8D) * 2) = local_498;
    }
    for (; local_36c < in_R8D; local_36c = local_36c + 1) {
      local_4a4 = 0x4000;
      for (local_4a8 = 0; local_4a8 < 8; local_4a8 = local_4a8 + 1) {
        local_4a4 = (int)*(short *)(*pauVar13 + (long)local_4a8 * 2) *
                    (uint)*(byte *)(lVar12 + local_36c * in_ESI + (long)local_4a8) + local_4a4;
      }
      *(short *)(in_RDX + (long)(local_36c + local_330 * in_R8D) * 2) =
           (short)(local_4a4 + ((1 << ((byte)shifted[1] & 0x1f)) >> 1) >> ((byte)shifted[1] & 0x1f))
      ;
    }
    local_32c = (int)src_row + local_32c;
  }
  return;
}

Assistant:

static void hfilter8(const uint8_t *src, int src_stride, int16_t *dst, int w,
                     int h, int subpel_x_qn, int x_step_qn,
                     const InterpFilterParams *filter_params, int round) {
  const int bd = 8;
  const int ntaps = 8;

  src -= ntaps / 2 - 1;

  int32_t round_add32 = (1 << round) / 2 + (1 << (bd + FILTER_BITS - 1));
  const __m128i round_add = _mm_set1_epi32(round_add32);
  const __m128i round_shift = _mm_cvtsi32_si128(round);

  int x_qn = subpel_x_qn;
  for (int x = 0; x < w; ++x, x_qn += x_step_qn) {
    const uint8_t *const src_col = src + (x_qn >> SCALE_SUBPEL_BITS);
    const int filter_idx = (x_qn & SCALE_SUBPEL_MASK) >> SCALE_EXTRA_BITS;
    assert(filter_idx < SUBPEL_SHIFTS);
    const int16_t *filter =
        av1_get_interp_filter_subpel_kernel(filter_params, filter_idx);

    // Load the filter coefficients
    const __m128i coefflo = _mm_loadu_si128((__m128i *)filter);
    const __m128i zero = _mm_castps_si128(_mm_setzero_ps());

    int y;
    for (y = 0; y <= h - 4; y += 4) {
      const uint8_t *const src0 = src_col + y * src_stride;
      const uint8_t *const src1 = src0 + 1 * src_stride;
      const uint8_t *const src2 = src0 + 2 * src_stride;
      const uint8_t *const src3 = src0 + 3 * src_stride;

      // Load up source data. This is 8-bit input data; each load is just
      // loading the lower half of the register and gets 8 pixels
      const __m128i data08 = _mm_loadl_epi64((__m128i *)src0);
      const __m128i data18 = _mm_loadl_epi64((__m128i *)src1);
      const __m128i data28 = _mm_loadl_epi64((__m128i *)src2);
      const __m128i data38 = _mm_loadl_epi64((__m128i *)src3);

      // Now zero-extend up to 16-bit precision by interleaving with
      // zeros. Drop the upper half of each register (which just had zeros)
      const __m128i data0lo = _mm_unpacklo_epi8(data08, zero);
      const __m128i data1lo = _mm_unpacklo_epi8(data18, zero);
      const __m128i data2lo = _mm_unpacklo_epi8(data28, zero);
      const __m128i data3lo = _mm_unpacklo_epi8(data38, zero);

      // Multiply by coefficients
      const __m128i conv0lo = _mm_madd_epi16(data0lo, coefflo);
      const __m128i conv1lo = _mm_madd_epi16(data1lo, coefflo);
      const __m128i conv2lo = _mm_madd_epi16(data2lo, coefflo);
      const __m128i conv3lo = _mm_madd_epi16(data3lo, coefflo);

      // Reduce horizontally and add
      const __m128i conv01lo = _mm_hadd_epi32(conv0lo, conv1lo);
      const __m128i conv23lo = _mm_hadd_epi32(conv2lo, conv3lo);
      const __m128i conv = _mm_hadd_epi32(conv01lo, conv23lo);

      // Divide down by (1 << round), rounding to nearest.
      __m128i shifted =
          _mm_sra_epi32(_mm_add_epi32(conv, round_add), round_shift);

      shifted = _mm_packus_epi32(shifted, shifted);
      // Write transposed to the output
      _mm_storel_epi64((__m128i *)(dst + y + x * h), shifted);
    }
    for (; y < h; ++y) {
      const uint8_t *const src_row = src_col + y * src_stride;

      int32_t sum = (1 << (bd + FILTER_BITS - 1));
      for (int k = 0; k < ntaps; ++k) {
        sum += filter[k] * src_row[k];
      }

      dst[y + x * h] = ROUND_POWER_OF_TWO(sum, round);
    }
  }
}